

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,float *value)

{
  bool bVar1;
  ostream *poVar2;
  float fVar3;
  from_chars_result_t<char> fVar4;
  expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  flt;
  string value_str;
  float result;
  float v;
  allocator local_209;
  string local_208;
  byte local_1e8;
  string local_1e0;
  string local_1c0;
  float local_1a0;
  undefined4 uStack_19c;
  size_type local_198;
  size_type local_190;
  undefined8 uStack_188;
  ios_base local_130 [264];
  
  bVar1 = MaybeNonFinite<float>(this,&local_1a0);
  if (bVar1) {
    *value = local_1a0;
    return true;
  }
  local_1e0._M_string_length = 0;
  local_1e0.field_2._M_local_buf[0] = '\0';
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  bVar1 = LexFloat(this,&local_1e0);
  if (!bVar1) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-basetype.cc"
               ,0x5f);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"ReadBasicType",0xd);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
    poVar2 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a0,0xb0b);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"Failed to lex floating value literal.",0x25);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"\n",1);
    ::std::__cxx11::stringbuf::str();
    PushError(this,&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
    ::std::ios_base::~ios_base(local_130);
    bVar1 = false;
    goto LAB_003ad2dc;
  }
  fVar4 = fast_float::from_chars_advanced<float,char>
                    (local_1e0._M_dataplus._M_p,
                     local_1e0._M_dataplus._M_p + local_1e0._M_string_length,(float *)&local_1c0,
                     (parse_options_t<char>)0x2e00000005);
  if (fVar4.ec == 0) {
    local_1e8 = 1;
    local_208._M_dataplus._M_p._0_4_ = local_1c0._M_dataplus._M_p._0_4_;
    fVar3 = local_1c0._M_dataplus._M_p._0_4_;
LAB_003ad19c:
    *value = fVar3;
    bVar1 = true;
  }
  else {
    local_1e8 = 0;
    ::std::__cxx11::string::string((string *)&local_1a0,"Parse failed.",&local_209);
    local_208._M_dataplus._M_p = (pointer)CONCAT44(uStack_19c,local_1a0);
    if ((size_type *)local_208._M_dataplus._M_p == &local_190) {
      local_208.field_2._8_8_ = uStack_188;
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    }
    local_208.field_2._M_allocated_capacity = local_190;
    local_208._M_string_length = local_198;
    fVar3 = SUB84(local_208._M_dataplus._M_p,0);
    if ((local_1e8 & 1) != 0) goto LAB_003ad19c;
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-basetype.cc"
               ,0x5f);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"ReadBasicType",0xd);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"():",3);
    poVar2 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a0,0xb12);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"Failed to parse floating value.",0x1f);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"\n",1);
    ::std::__cxx11::stringbuf::str();
    PushError(this,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1c0._M_dataplus._M_p._4_4_,local_1c0._M_dataplus._M_p._0_4_) !=
        &local_1c0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1c0._M_dataplus._M_p._4_4_,local_1c0._M_dataplus._M_p._0_4_),
                      local_1c0.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
    ::std::ios_base::~ios_base(local_130);
    bVar1 = false;
  }
  if ((local_1e8 == 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2)) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
LAB_003ad2dc:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,
                    CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                             local_1e0.field_2._M_local_buf[0]) + 1);
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(float *value) {
  // -inf, inf, nan
  {
    float v;
    if (MaybeNonFinite(&v)) {
      (*value) = v;
      return true;
    }
  }

  std::string value_str;
  if (!LexFloat(&value_str)) {
    PUSH_ERROR_AND_RETURN("Failed to lex floating value literal.");
  }

  auto flt = ParseFloat(value_str);
  if (flt) {
    (*value) = flt.value();
  } else {
    PUSH_ERROR_AND_RETURN("Failed to parse floating value.");
  }

  return true;
}